

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O0

shared_ptr<Jupiter::IRC::Client::Channel::User> __thiscall
Jupiter::IRC::Client::Channel::addUser(Channel *this,shared_ptr<Jupiter::IRC::Client::User> *user)

{
  element_type *peVar1;
  element_type *peVar2;
  string *__k;
  mapped_type *this_00;
  __shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Jupiter::IRC::Client::Channel::User> sVar3;
  shared_ptr<Jupiter::IRC::Client::User> *user_local;
  Channel *this_local;
  shared_ptr<Jupiter::IRC::Client::Channel::User> *channel_user;
  
  std::make_shared<Jupiter::IRC::Client::Channel::User>();
  peVar1 = std::
           __shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::shared_ptr<Jupiter::IRC::Client::User>::operator=
            (&peVar1->m_user,(shared_ptr<Jupiter::IRC::Client::User> *)in_RDX);
  peVar2 = std::
           __shared_ptr_access<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->(in_RDX);
  peVar2->m_channel_count = peVar2->m_channel_count + 1;
  peVar1 = std::
           __shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  __k = User::getNickname_abi_cxx11_(peVar1);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>_>
            ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Jupiter::IRC::Client::Channel::User>_>_>_>
                          *)(user + 3),__k);
  std::shared_ptr<Jupiter::IRC::Client::Channel::User>::operator=
            (this_00,(shared_ptr<Jupiter::IRC::Client::Channel::User> *)this);
  sVar3.super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Jupiter::IRC::Client::Channel::User>)
         sVar3.super___shared_ptr<Jupiter::IRC::Client::Channel::User,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Jupiter::IRC::Client::Channel::User> Jupiter::IRC::Client::Channel::addUser(std::shared_ptr<Client::User> user) {
	auto channel_user = std::make_shared<Channel::User>();
	channel_user->m_user = user;

	++user->m_channel_count;

	m_users[channel_user->getNickname()] = channel_user;
	return channel_user;
}